

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void on_io_open_complete(void *context,IO_OPEN_RESULT open_result)

{
  int iVar1;
  XIO_HANDLE socketio;
  char to_send [41];
  char local_48 [48];
  
  puts("Open complete called\r");
  if (open_result == IO_OPEN_OK) {
    builtin_strncpy(local_48 + 0x20,".com\r\n\r\n",9);
    builtin_strncpy(local_48 + 0x10,"Host: www.google",0x10);
    builtin_strncpy(local_48,"GET / HTTP/1.1\r\n",0x10);
    puts("Sending bytes ...\r");
    iVar1 = xio_send((XIO_HANDLE)context,local_48,0x29,on_send_complete,(void *)0x0);
    if (iVar1 != 0) {
      puts("Send failed\r");
    }
    return;
  }
  puts("Open error\r");
  return;
}

Assistant:

static void on_io_open_complete(void* context, IO_OPEN_RESULT open_result)
{
    (void)context, (void)open_result;
    (void)printf("Open complete called\r\n");

    if (open_result == IO_OPEN_OK)
    {
        XIO_HANDLE socketio = (XIO_HANDLE)context;
        const char to_send[] = "GET / HTTP/1.1\r\n"
            "Host: www.google.com\r\n"
            "\r\n";
        (void)printf("Sending bytes ...\r\n");
        if (xio_send(socketio, to_send, sizeof(to_send), on_send_complete, NULL) != 0)
        {
            (void)printf("Send failed\r\n");
        }
    }
    else
    {
        (void)printf("Open error\r\n");
    }
}